

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O2

void INT_REVset_attr_list(CMConnection conn,EVstone stone_id,attr_list list)

{
  int condition;
  CMFormat format;
  int local_38;
  EVstone local_34;
  void *local_30;
  
  condition = INT_CMCondition_get(conn->cm,conn);
  format = INT_CMlookup_format(conn->cm,EVset_attr_list_req_formats);
  local_34 = stone_id;
  local_30 = (void *)attr_list_to_string(list);
  local_38 = condition;
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EVset_attr_list_req_formats);
  }
  INT_CMCondition_set_client_data(conn->cm,condition,(void *)0x0);
  INT_CMwrite(conn,format,&local_38);
  free(local_30);
  INT_CMCondition_wait(conn->cm,condition);
  return;
}

Assistant:

extern void
INT_REVset_attr_list(CMConnection conn, EVstone stone_id, attr_list list)
{
    int cond;
    CMFormat f;
    EVset_attr_list_request request;
    memset(&request, 0, sizeof(request));
    cond = INT_CMCondition_get(conn->cm, conn);
    f = INT_CMlookup_format(conn->cm, EVset_attr_list_req_formats);
    request.stone_id = stone_id;
    request.list = attr_list_to_string(list);
    request.condition_var = cond;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EVset_attr_list_req_formats);
    }
    INT_CMCondition_set_client_data(conn->cm, cond, NULL);
    INT_CMwrite(conn, f, &request);
    free(request.list);
    INT_CMCondition_wait(conn->cm, cond);
}